

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O0

Char * __thiscall Diligent::StringPool::CopyString(StringPool *this,char *Str)

{
  Char CVar1;
  Char *pCVar2;
  bool bVar3;
  undefined1 local_48 [8];
  string msg;
  Char *Ptr;
  char *Str_local;
  StringPool *this_local;
  
  if (Str == (char *)0x0) {
    this_local = (StringPool *)0x0;
  }
  else {
    msg.field_2._8_8_ = this->m_pCurrPtr;
    Ptr = Str;
    while( true ) {
      bVar3 = false;
      if (*Ptr != '\0') {
        bVar3 = this->m_pCurrPtr < this->m_pBuffer + this->m_ReservedSize;
      }
      if (!bVar3) break;
      CVar1 = *Ptr;
      pCVar2 = this->m_pCurrPtr;
      this->m_pCurrPtr = pCVar2 + 1;
      *pCVar2 = CVar1;
      Ptr = Ptr + 1;
    }
    if (this->m_pCurrPtr < this->m_pBuffer + this->m_ReservedSize) {
      pCVar2 = this->m_pCurrPtr;
      this->m_pCurrPtr = pCVar2 + 1;
      *pCVar2 = '\0';
    }
    else {
      FormatString<char[45]>
                ((string *)local_48,(char (*) [45])"Not enough space reserved in the string pool");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CopyString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
                 ,0x95);
      std::__cxx11::string::~string((string *)local_48);
    }
    this_local = (StringPool *)msg.field_2._8_8_;
  }
  return (Char *)this_local;
}

Assistant:

Char* CopyString(const char* Str)
    {
        if (Str == nullptr)
            return nullptr;

        auto* Ptr = m_pCurrPtr;
        while (*Str != 0 && m_pCurrPtr < m_pBuffer + m_ReservedSize)
        {
            *(m_pCurrPtr++) = *(Str++);
        }
        if (m_pCurrPtr < m_pBuffer + m_ReservedSize)
            *(m_pCurrPtr++) = 0;
        else
            UNEXPECTED("Not enough space reserved in the string pool");
        return Ptr;
    }